

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O0

Status __thiscall
sentencepiece::SentencePieceProcessor::ResetVocabulary(SentencePieceProcessor *this)

{
  bool bVar1;
  ModelProto_SentencePiece_Type MVar2;
  pointer this_00;
  long *in_RSI;
  ModelProto_SentencePiece *in_RDI;
  ModelProto_SentencePiece *piece;
  iterator __end1;
  iterator __begin1;
  RepeatedPtrField<sentencepiece::ModelProto_SentencePiece> *__range1;
  Status *_status;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  ModelProto_SentencePiece_Type value;
  _Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false> this_01;
  iterator local_40;
  RepeatedPtrIterator<sentencepiece::ModelProto_SentencePiece> local_38;
  RepeatedPtrField<sentencepiece::ModelProto_SentencePiece> *local_30;
  uint local_28;
  byte local_11;
  
  local_11 = 0;
  this_01._M_head_impl = (Rep *)in_RDI;
  (**(code **)(*in_RSI + 0x38))(in_RDI);
  bVar1 = util::Status::ok((Status *)0x3ddde7);
  value = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff9c);
  if (!bVar1) {
    local_11 = 1;
  }
  local_28 = (uint)!bVar1;
  if ((local_11 & 1) == 0) {
    util::Status::~Status((Status *)0x3dde3c);
  }
  if (local_28 == 0) {
    this_00 = std::
              unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
              ::operator->((unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
                            *)0x3dde5b);
    local_30 = ModelProto::mutable_pieces(this_00);
    local_38.it_ = (void **)google::protobuf::
                            RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::begin
                                      ((RepeatedPtrField<sentencepiece::ModelProto_SentencePiece> *)
                                       CONCAT44(value,in_stack_ffffffffffffff98));
    local_40.it_ = (void **)google::protobuf::
                            RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::end
                                      ((RepeatedPtrField<sentencepiece::ModelProto_SentencePiece> *)
                                       this_01._M_head_impl);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<sentencepiece::ModelProto_SentencePiece>::operator!=
                             (&local_38,&local_40), bVar1) {
      google::protobuf::internal::RepeatedPtrIterator<sentencepiece::ModelProto_SentencePiece>::
      operator*(&local_38);
      MVar2 = ModelProto_SentencePiece::type((ModelProto_SentencePiece *)0x3ddeb4);
      if (MVar2 == ModelProto_SentencePiece_Type_UNUSED) {
        ModelProto_SentencePiece::set_type(in_RDI,value);
      }
      google::protobuf::internal::RepeatedPtrIterator<sentencepiece::ModelProto_SentencePiece>::
      operator++(&local_38);
    }
    util::OkStatus();
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this_01._M_head_impl;
}

Assistant:

util::Status SentencePieceProcessor::ResetVocabulary() {
  RETURN_IF_ERROR(status());
  for (auto &piece : *(model_proto_->mutable_pieces())) {
    if (piece.type() == ModelProto::SentencePiece::UNUSED)
      piece.set_type(ModelProto::SentencePiece::NORMAL);
  }

  return util::OkStatus();
}